

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void mov_DHIb(PDISASM pMyDisasm)

{
  int iVar1;
  char (*__src) [8];
  ulong MyNumber;
  
  (pMyDisasm->Instruction).Category = 0x10001;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"mov",4);
  iVar1 = Security(2,pMyDisasm);
  if (iVar1 != 0) {
    (pMyDisasm->Reserved_).ImmediatSize = 8;
    MyNumber = (ulong)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1);
    CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand2).OpMnemonic,"%.2X",MyNumber);
    (pMyDisasm->Instruction).Immediat = MyNumber;
    __src = (char (*) [8])(Registers8BitsLegacy + 6);
    if ((pMyDisasm->Reserved_).REX.state == '\x01') {
      __src = Registers8Bits + 6;
    }
    strcpy((pMyDisasm->Operand1).OpMnemonic,*__src);
    (pMyDisasm->Operand1).OpType = 0x20000;
    (pMyDisasm->Operand1).Registers.type = 1;
    (pMyDisasm->Operand1).Registers.gpr = 4;
    (pMyDisasm->Operand1).OpSize = 8;
    (pMyDisasm->Operand1).OpPosition = 1;
    (pMyDisasm->Operand2).OpType = 0x8040000;
    (pMyDisasm->Operand2).OpSize = 8;
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 2;
  }
  return;
}

Assistant:

void __bea_callspec__ mov_DHIb(PDISASM pMyDisasm)
{
    long MyNumber;
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+DATA_TRANSFER;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "mov");
    #endif
    if (!Security(2, pMyDisasm)) return;
    GV.ImmediatSize = 8;
    MyNumber = *((UInt8*) (GV.EIP_+1));
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) CopyFormattedNumber(pMyDisasm, (char*) &pMyDisasm->Operand2.OpMnemonic,"%.2X",(Int64) MyNumber);
    #endif
    pMyDisasm->Instruction.Immediat = MyNumber;
    if (GV.REX.state == InUsePrefix) {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy((char*) &pMyDisasm->Operand1.OpMnemonic, Registers8Bits[6]);
      #endif
    }
    else {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy((char*) &pMyDisasm->Operand1.OpMnemonic, Registers8BitsLegacy[6]);
      #endif
    }
    pMyDisasm->Operand1.OpType = REGISTER_TYPE;
    pMyDisasm->Operand1.Registers.type = GENERAL_REG;
    pMyDisasm->Operand1.Registers.gpr = REG2;
    pMyDisasm->Operand1.OpPosition = HighPosition;
    pMyDisasm->Operand1.OpSize = 8;
    pMyDisasm->Operand2.OpType = CONSTANT_TYPE+ABSOLUTE_;
    pMyDisasm->Operand2.OpSize = 8;
    GV.EIP_ += 2;
}